

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

uint __thiscall Js::FunctionBody::GetStatementStartOffset(FunctionBody *this,uint statementIndex)

{
  Type *pTVar1;
  StatementMapList *statementMapList;
  StatementMap *this_00;
  StatementMap *statementMap;
  uint local_38;
  int index;
  StatementData data;
  SmallSpanSequenceIter iter;
  SourceInfo *sourceInfo;
  uint startOffset;
  uint statementIndex_local;
  FunctionBody *this_local;
  
  sourceInfo._0_4_ = 0;
  if (statementIndex != 0xffffffff) {
    pTVar1 = &this->m_sourceInfo;
    if (pTVar1->pSpanSequence == (Type)0x0) {
      statementMap._4_4_ = statementIndex;
      statementMapList = GetStatementMaps(this);
      this_00 = GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
                          (statementMapList,(int *)((long)&statementMap + 4));
      sourceInfo._0_4_ = regex::Interval::Begin(&this_00->sourceSpan);
    }
    else {
      SmallSpanSequenceIter::SmallSpanSequenceIter((SmallSpanSequenceIter *)&data);
      SmallSpanSequence::Reset(pTVar1->pSpanSequence,(SmallSpanSequenceIter *)&data);
      StatementData::StatementData((StatementData *)&stack0xffffffffffffffc8);
      SmallSpanSequence::Item
                (pTVar1->pSpanSequence,statementIndex,(SmallSpanSequenceIter *)&data,
                 (StatementData *)&stack0xffffffffffffffc8);
      sourceInfo._0_4_ = local_38;
    }
  }
  return (uint)sourceInfo;
}

Assistant:

uint FunctionBody::GetStatementStartOffset(const uint statementIndex)
    {
        uint startOffset = 0;

        if (statementIndex != Js::Constants::NoStatementIndex)
        {
            const Js::FunctionBody::SourceInfo * sourceInfo = &(this->m_sourceInfo);
            if (sourceInfo->pSpanSequence != nullptr)
            {
                Js::SmallSpanSequenceIter iter;
                sourceInfo->pSpanSequence->Reset(iter);
                Js::StatementData data;
                sourceInfo->pSpanSequence->Item(statementIndex, iter, data);
                startOffset = data.sourceBegin;
            }
            else
            {
                int index = statementIndex;
                Js::FunctionBody::StatementMap * statementMap = GetNextNonSubexpressionStatementMap(GetStatementMaps(), index);
                startOffset = statementMap->sourceSpan.Begin();
            }
        }

        return startOffset;
    }